

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoll.c
# Opt level: O0

int ffgcx(fitsfile *fptr,int colnum,LONGLONG frow,LONGLONG fbit,LONGLONG nbit,char *larray,
         int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  int iVar3;
  tcolumn *colptr;
  int local_90;
  int iStack_8c;
  uchar cbuff;
  int descrp;
  int tcode;
  LONGLONG estart;
  LONGLONG rstart;
  long fbyte;
  long bitloc;
  long repeat;
  long ii;
  long ndone;
  long offset;
  LONGLONG bstart;
  char *larray_local;
  LONGLONG nbit_local;
  LONGLONG fbit_local;
  LONGLONG frow_local;
  fitsfile *pfStack_18;
  int colnum_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    if (nbit < 1) {
      fptr_local._4_4_ = *status;
    }
    else if (frow < 1) {
      *status = 0x133;
      fptr_local._4_4_ = 0x133;
    }
    else if (fbit < 1) {
      *status = 0x134;
      fptr_local._4_4_ = 0x134;
    }
    else {
      bstart = (LONGLONG)larray;
      larray_local = (char *)nbit;
      nbit_local = fbit;
      fbit_local = frow;
      frow_local._4_4_ = colnum;
      pfStack_18 = fptr;
      if (fptr->HDUposition == fptr->Fptr->curhdu) {
        if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2)) {
          return *status;
        }
      }
      else {
        ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
      }
      rstart = (nbit_local + 7) / 8;
      fbyte = nbit_local + -1 + ((nbit_local + -1) / 8) * -8;
      ii = 0;
      estart = fbit_local + -1;
      _descrp = rstart + -1;
      ptVar1 = pfStack_18->Fptr->tableptr;
      iVar3 = frow_local._4_4_ + -1;
      iStack_8c = ptVar1[iVar3].tdatatype;
      iVar2 = iStack_8c;
      if (iStack_8c < 1) {
        iVar2 = -iStack_8c;
      }
      if (iVar2 < 0xc) {
        if (iStack_8c < 1) {
          local_90 = 1;
          ffgdes(pfStack_18,frow_local._4_4_,fbit_local,&bitloc,&ndone,status);
          if (iStack_8c == -1) {
            bitloc = (bitloc + 7) / 8;
          }
          if (bitloc < (long)(larray_local + nbit_local + 6) / 8) {
            *status = 0x134;
            return 0x134;
          }
          offset = pfStack_18->Fptr->datastart + ndone + pfStack_18->Fptr->heapstart + _descrp;
        }
        else {
          local_90 = 0;
          bitloc = ptVar1[iVar3].trepeat;
          if (iStack_8c == 1) {
            bitloc = (bitloc + 7) / 8;
          }
          if (bitloc < rstart) {
            *status = 0x134;
            return 0x134;
          }
          offset = pfStack_18->Fptr->datastart + pfStack_18->Fptr->rowlength * estart +
                   ptVar1[iVar3].tbcol + _descrp;
        }
        iVar2 = ffmbyt(pfStack_18,offset,0,status);
        if (iVar2 < 1) {
          while (iVar2 = ffgbyt(pfStack_18,1,(void *)((long)&colptr + 7),status), iVar2 < 1) {
            for (repeat = fbyte; repeat < 8 && ii < (long)larray_local; repeat = repeat + 1) {
              if ((colptr._7_1_ & ffgcx::onbit[repeat]) == 0) {
                *(undefined1 *)(bstart + ii) = 0;
              }
              else {
                *(undefined1 *)(bstart + ii) = 1;
              }
              ii = ii + 1;
            }
            if ((char *)ii == larray_local) {
              return *status;
            }
            if ((local_90 == 0) && (_descrp = _descrp + 1, _descrp == bitloc)) {
              _descrp = 0;
              estart = estart + 1;
              offset = pfStack_18->Fptr->datastart + pfStack_18->Fptr->rowlength * estart +
                       ptVar1[iVar3].tbcol;
              ffmbyt(pfStack_18,offset,0,status);
            }
            fbyte = 0;
          }
          fptr_local._4_4_ = *status;
        }
        else {
          fptr_local._4_4_ = *status;
        }
      }
      else {
        *status = 0x136;
        fptr_local._4_4_ = 0x136;
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcx(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int   colnum,    /* I - number of column to write (1 = 1st col) */
            LONGLONG  frow,      /* I - first row to write (1 = 1st row)        */
            LONGLONG  fbit,      /* I - first bit to write (1 = 1st)            */
            LONGLONG  nbit,      /* I - number of bits to write                 */
            char *larray,    /* O - array of logicals corresponding to bits */
            int  *status)    /* IO - error status                           */
/*
  read an array of logical values from a specified bit or byte
  column of the binary table.    larray is set = TRUE, if the corresponding
  bit = 1, otherwise it is set to FALSE.
  The binary table column being read from must have datatype 'B' or 'X'. 
*/
{
    LONGLONG bstart;
    long offset, ndone, ii, repeat, bitloc, fbyte;
    LONGLONG  rstart, estart;
    int tcode, descrp;
    unsigned char cbuff;
    static unsigned char onbit[8] = {128,  64,  32,  16,   8,   4,   2,   1};
    tcolumn *colptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  check input parameters */
    if (nbit < 1)
        return(*status);
    else if (frow < 1)
        return(*status = BAD_ROW_NUM);
    else if (fbit < 1)
        return(*status = BAD_ELEM_NUM);

    /* position to the correct HDU */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    fbyte = (long) ((fbit + 7) / 8);
    bitloc = (long) (fbit - 1 - ((fbit - 1) / 8 * 8));
    ndone = 0;
    rstart = frow - 1;
    estart = fbyte - 1;

    colptr  = (fptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */

    tcode = colptr->tdatatype;

    if (abs(tcode) > TBYTE)
        return(*status = NOT_LOGICAL_COL); /* not correct datatype column */

    if (tcode > 0)
    {
        descrp = FALSE;  /* not a variable length descriptor column */
        /* N.B: REPEAT is the number of bytes, not number of bits */
        repeat = (long) colptr->trepeat;

        if (tcode == TBIT)
            repeat = (repeat + 7) / 8;  /* convert from bits to bytes */

        if (fbyte > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol + estart;
    }
    else
    {
        descrp = TRUE;  /* a variable length descriptor column */
        /* only bit arrays (tform = 'X') are supported for variable */
        /* length arrays.  REPEAT is the number of BITS in the array. */

        ffgdes(fptr, colnum, frow, &repeat, &offset, status);

        if (tcode == -TBIT)
            repeat = (repeat + 7) / 8;

        if ((fbit + nbit + 6) / 8 > repeat)
            return(*status = BAD_ELEM_NUM);

        /* calc the i/o pointer location to start of sequence of pixels */
        bstart = (fptr->Fptr)->datastart + offset + (fptr->Fptr)->heapstart + estart;
    }

    /* move the i/o pointer to the start of the pixel sequence */
    if (ffmbyt(fptr, bstart, REPORT_EOF, status) > 0)
        return(*status);

    /* read the next byte */
    while (1)
    {
      if (ffgbyt(fptr, 1, &cbuff, status) > 0)
        return(*status);

      for (ii = bitloc; (ii < 8) && (ndone < nbit); ii++, ndone++)
      {
        if(cbuff & onbit[ii])       /* test if bit is set */
          larray[ndone] = TRUE;
        else
          larray[ndone] = FALSE;
      }

      if (ndone == nbit)   /* finished all the bits */
        return(*status);

      /* not done, so get the next byte */
      if (!descrp)
      {
        estart++;
        if (estart == repeat) 
        {
          /* move the i/o pointer to the next row of pixels */
          estart = 0;
          rstart = rstart + 1;
          bstart = (fptr->Fptr)->datastart + ((fptr->Fptr)->rowlength * rstart) +
               colptr->tbcol;

          ffmbyt(fptr, bstart, REPORT_EOF, status);
        }
      }
      bitloc = 0;
    }
}